

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O3

void __thiscall Moc::parseProperty(Moc *this,ClassDef *def,PropertyMode mode)

{
  long lVar1;
  long in_FS_OFFSET;
  PropertyDef PStack_188;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (this->super_Parser).index;
  if ((lVar1 < (this->super_Parser).symbols.d.size) &&
     ((this->super_Parser).symbols.d.ptr[lVar1].token == LPAREN)) {
    (this->super_Parser).index = lVar1 + 1;
    PStack_188.constant = true;
    PStack_188.final = true;
    PStack_188.required = true;
    PStack_188._331_1_ = 0xaa;
    PStack_188.relativeIndex = -0x55555556;
    memset(&PStack_188,0,0x138);
    PStack_188.notifyId = -1;
    PStack_188._316_7_ = 0;
    PStack_188.revision._3_1_ = 0;
    PStack_188.typeTag.super_QFlagsStorageHelper<TypeTag,_4>.super_QFlagsStorage<TypeTag>.i =
         (QFlagsStorageHelper<TypeTag,_4>)(QFlagsStorage<TypeTag>)0x0;
    PStack_188._328_4_ = PStack_188._328_4_ & 0xff000000;
    PStack_188.relativeIndex = -1;
    PStack_188.location = -1;
    createPropertyDef(this,&PStack_188,(int)(def->propertyList).d.size,mode);
    lVar1 = (this->super_Parser).index;
    if ((lVar1 < (this->super_Parser).symbols.d.size) &&
       ((this->super_Parser).symbols.d.ptr[lVar1].token == PP_RPAREN)) {
      (this->super_Parser).index = lVar1 + 1;
      QtPrivate::QMovableArrayOps<PropertyDef>::emplace<PropertyDef_const&>
                ((QMovableArrayOps<PropertyDef> *)&def->propertyList,(def->propertyList).d.size,
                 &PStack_188);
      QList<PropertyDef>::end(&def->propertyList);
      PropertyDef::~PropertyDef(&PStack_188);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return;
      }
      __stack_chk_fail();
    }
  }
  Parser::error(&this->super_Parser,(char *)0x0);
}

Assistant:

void Moc::parseProperty(ClassDef *def, Moc::PropertyMode mode)
{
    next(LPAREN);
    PropertyDef propDef;
    createPropertyDef(propDef, int(def->propertyList.size()), mode);
    next(RPAREN);

    def->propertyList += propDef;
}